

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O1

void __thiscall cmCMakePresetsGraph::Preset::Preset(Preset *this,Preset *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  File *pFVar5;
  undefined7 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  this->_vptr_Preset = (_func_int **)&PTR__Preset_00a52dc0;
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Name)._M_dataplus._M_p;
  paVar7 = &(param_1->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(param_1->Name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Name).field_2 + 8) = uVar4;
  }
  else {
    (this->Name)._M_dataplus._M_p = pcVar2;
    (this->Name).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->Name)._M_string_length = (param_1->Name)._M_string_length;
  (param_1->Name)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->Name)._M_string_length = 0;
  (param_1->Name).field_2._M_local_buf[0] = '\0';
  (this->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Inherits).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->Inherits).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Inherits).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Inherits).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = *(undefined7 *)&param_1->field_0x41;
  pFVar5 = param_1->OriginFile;
  this->Hidden = param_1->Hidden;
  *(undefined7 *)&this->field_0x41 = uVar6;
  this->OriginFile = pFVar5;
  paVar1 = &(this->DisplayName).field_2;
  (this->DisplayName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->DisplayName)._M_dataplus._M_p;
  paVar7 = &(param_1->DisplayName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(param_1->DisplayName).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->DisplayName).field_2 + 8) = uVar4;
  }
  else {
    (this->DisplayName)._M_dataplus._M_p = pcVar2;
    (this->DisplayName).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->DisplayName)._M_string_length = (param_1->DisplayName)._M_string_length;
  (param_1->DisplayName)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->DisplayName)._M_string_length = 0;
  (param_1->DisplayName).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->Description).field_2;
  (this->Description)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Description)._M_dataplus._M_p;
  paVar7 = &(param_1->Description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(param_1->Description).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Description).field_2 + 8) = uVar4;
  }
  else {
    (this->Description)._M_dataplus._M_p = pcVar2;
    (this->Description).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->Description)._M_string_length = (param_1->Description)._M_string_length;
  (param_1->Description)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->Description)._M_string_length = 0;
  (param_1->Description).field_2._M_local_buf[0] = '\0';
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->ConditionEvaluator).
       super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (param_1->ConditionEvaluator).
           super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (param_1->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  (param_1->ConditionEvaluator).
  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->ConditionResult = param_1->ConditionResult;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->Environment)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->Environment)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

Preset(Preset&& /*other*/) = default;